

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_std::pair<const_int,_int>_&> * __thiscall
testing::internal::PairMatcher::operator_cast_to_Matcher
          (Matcher<const_std::pair<const_int,_int>_&> *__return_storage_ptr__,PairMatcher *this)

{
  PairMatcherImpl<std::pair<int_const,int>const&> *this_00;
  PairMatcher<int,_int> *this_local;
  
  this_00 = (PairMatcherImpl<std::pair<int_const,int>const&> *)operator_new(0x38);
  PairMatcherImpl<std::pair<int_const,int>const&>::PairMatcherImpl<int,int>
            (this_00,*(int *)this,*(int *)(this + 4));
  Matcher<const_std::pair<const_int,_int>_&>::Matcher
            (__return_storage_ptr__,(MatcherInterface<const_std::pair<const_int,_int>_&> *)this_00);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<PairType>() const {
    return Matcher<PairType>(
        new PairMatcherImpl<const PairType&>(first_matcher_, second_matcher_));
  }